

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O0

value hello_world_object_impl_interface_get(object obj,object_impl impl,accessor_type *accessor)

{
  int iVar1;
  char *__s1;
  long in_RDX;
  char *in_RSI;
  char *key;
  attribute attr;
  hello_world_object hello_world;
  value local_8;
  
  __s1 = (char *)attribute_name(*(undefined8 *)(in_RDX + 8));
  iVar1 = strcmp(__s1,"d");
  if (iVar1 == 0) {
    local_8 = (value)value_create_char((int)*in_RSI);
  }
  else {
    iVar1 = strcmp(__s1,"e");
    if (iVar1 == 0) {
      local_8 = (value)value_create_long(*(undefined8 *)(in_RSI + 8));
    }
    else {
      local_8 = (value)0x0;
    }
  }
  return local_8;
}

Assistant:

value hello_world_object_impl_interface_get(object obj, object_impl impl, struct accessor_type *accessor)
{
	hello_world_object hello_world = (hello_world_object)impl;
	attribute attr = accessor->data.attr;
	const char *key = attribute_name(attr);

	(void)obj;

	// Horrible but it is just a ilustrative example
	if (strcmp(key, "d") == 0)
	{
		return value_create_char(hello_world->d);
	}
	else if (strcmp(key, "e") == 0)
	{
		return value_create_long(hello_world->e);
	}

	return NULL;
}